

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

void __thiscall testing::internal::UnitTestImpl::ListTestsMatchingFilter(UnitTestImpl *this)

{
  TestCase *this_00;
  bool bVar1;
  size_type sVar2;
  reference ppTVar3;
  vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_> *pvVar4;
  char *pcVar5;
  const_reference ppTVar6;
  long in_RDI;
  TestInfo *test_info;
  size_t j;
  bool printed_test_case_name;
  TestCase *test_case;
  size_t i;
  int kMaxParamLength;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  char *str;
  char *local_30;
  ulong local_18;
  
  local_18 = 0;
  while( true ) {
    sVar2 = std::vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>::size
                      ((vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_> *)
                       (in_RDI + 0xb8));
    if (sVar2 <= local_18) break;
    ppTVar3 = std::vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>::operator[]
                        ((vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_> *)
                         (in_RDI + 0xb8),local_18);
    this_00 = *ppTVar3;
    bVar1 = false;
    local_30 = (char *)0x0;
    while( true ) {
      str = local_30;
      pvVar4 = TestCase::test_info_list(this_00);
      pcVar5 = (char *)std::vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>::size
                                 (pvVar4);
      if (pcVar5 <= str) break;
      pvVar4 = TestCase::test_info_list(this_00);
      ppTVar6 = std::vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>::operator[]
                          (pvVar4,(size_type)local_30);
      if (((*ppTVar6)->matches_filter_ & 1U) != 0) {
        if (!bVar1) {
          bVar1 = true;
          pcVar5 = TestCase::name((TestCase *)0x136ecd);
          printf("%s.",pcVar5);
          pcVar5 = TestCase::type_param
                             ((TestCase *)
                              CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
          if (pcVar5 != (char *)0x0) {
            printf("  # %s = ","TypeParam");
            TestCase::type_param
                      ((TestCase *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
            PrintOnOneLine(str,in_stack_ffffffffffffffac);
          }
          printf("\n");
        }
        pcVar5 = TestInfo::name((TestInfo *)0x136f32);
        printf("  %s",pcVar5);
        pcVar5 = TestInfo::value_param
                           ((TestInfo *)
                            CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
        if (pcVar5 != (char *)0x0) {
          printf("  # %s = ","GetParam()");
          TestInfo::value_param
                    ((TestInfo *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
          PrintOnOneLine(str,in_stack_ffffffffffffffac);
        }
        printf("\n");
      }
      local_30 = local_30 + 1;
    }
    local_18 = local_18 + 1;
  }
  fflush(_stdout);
  return;
}

Assistant:

void UnitTestImpl::ListTestsMatchingFilter() {
  // Print at most this many characters for each type/value parameter.
  const int kMaxParamLength = 250;

  for (size_t i = 0; i < test_cases_.size(); i++) {
    const TestCase* const test_case = test_cases_[i];
    bool printed_test_case_name = false;

    for (size_t j = 0; j < test_case->test_info_list().size(); j++) {
      const TestInfo* const test_info =
          test_case->test_info_list()[j];
      if (test_info->matches_filter_) {
        if (!printed_test_case_name) {
          printed_test_case_name = true;
          printf("%s.", test_case->name());
          if (test_case->type_param() != NULL) {
            printf("  # %s = ", kTypeParamLabel);
            // We print the type parameter on a single line to make
            // the output easy to parse by a program.
            PrintOnOneLine(test_case->type_param(), kMaxParamLength);
          }
          printf("\n");
        }
        printf("  %s", test_info->name());
        if (test_info->value_param() != NULL) {
          printf("  # %s = ", kValueParamLabel);
          // We print the value parameter on a single line to make the
          // output easy to parse by a program.
          PrintOnOneLine(test_info->value_param(), kMaxParamLength);
        }
        printf("\n");
      }
    }
  }
  fflush(stdout);
}